

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cpp
# Opt level: O2

Type * LLVMBC::Type::getIntTy(LLVMContext *context,uint32_t width)

{
  pointer ppTVar1;
  Type *type;
  IntegerType *pIVar2;
  Vector<Type_*> *__range1;
  pointer ppTVar3;
  uint32_t local_3c;
  IntegerType *local_38;
  
  ppTVar3 = (context->type_cache).
            super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppTVar1 = (context->type_cache).
            super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  local_3c = width;
  while( true ) {
    if (ppTVar3 == ppTVar1) {
      pIVar2 = LLVMContext::construct<LLVMBC::IntegerType,LLVMBC::LLVMContext&,unsigned_int&>
                         (context,context,&local_3c);
      local_38 = pIVar2;
      std::vector<LLVMBC::Type*,dxil_spv::ThreadLocalAllocator<LLVMBC::Type*>>::
      emplace_back<LLVMBC::Type*>
                ((vector<LLVMBC::Type*,dxil_spv::ThreadLocalAllocator<LLVMBC::Type*>> *)
                 &context->type_cache,(Type **)&local_38);
      return &pIVar2->super_Type;
    }
    type = *ppTVar3;
    if ((type->type_id == IntegerTyID) &&
       (pIVar2 = cast<LLVMBC::IntegerType>(type), pIVar2->width == width)) break;
    ppTVar3 = ppTVar3 + 1;
  }
  return type;
}

Assistant:

Type *Type::getIntTy(LLVMContext &context, uint32_t width)
{
	auto &cache = context.get_type_cache();
	for (auto *type : cache)
		if (type->getTypeID() == TypeID::IntegerTyID && cast<IntegerType>(type)->getBitWidth() == width)
			return type;

	auto *type = context.construct<IntegerType>(context, width);
	cache.push_back(type);
	return type;
}